

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O2

wchar_t fl_utf8test(char *src,uint srclen)

{
  undefined8 in_RAX;
  wchar_t wVar1;
  char *end;
  undefined8 uStack_28;
  wchar_t len;
  
  end = src + srclen;
  wVar1 = L'\x01';
  uStack_28 = in_RAX;
  do {
    while( true ) {
      if (end <= src) {
        return wVar1;
      }
      if (*src < '\0') break;
      src = src + 1;
    }
    fl_utf8decode(src,end,&len);
    if (wVar1 < len) {
      wVar1 = len;
    }
    src = src + (uint)len;
  } while (L'\x01' < len);
  return L'\0';
}

Assistant:

int fl_utf8test(const char* src, unsigned srclen) {
  int ret = 1;
  const char* p = src;
  const char* e = src+srclen;
  while (p < e) {
    if (*p & 0x80) {
      int len; fl_utf8decode(p,e,&len);
      if (len < 2) return 0;
      if (len > ret) ret = len;
      p += len;
    } else {
      p++;
    }
  }
  return ret;
}